

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O3

Bool ParseTabs(TidyDocImpl *doc,TidyOptionImpl *entry)

{
  int iVar1;
  uint in_EAX;
  Bool BVar2;
  uint flag;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  BVar2 = GetParsePickListValue(doc,entry,(uint *)((long)&uStack_28 + 4));
  if (BVar2 != no) {
    iVar1 = uStack_28._4_4_;
    prvTidySetOptionBool(doc,entry->id,(uint)(uStack_28._4_4_ != 0));
    if (iVar1 != 0) {
      prvTidySetOptionInt(doc,TidyIndentSpaces,1);
    }
  }
  return BVar2;
}

Assistant:

Bool ParseTabs( TidyDocImpl* doc, const TidyOptionImpl* entry )
{
    uint flag = 0;
    Bool status = GetParsePickListValue( doc, entry, &flag );
    
    if ( status ) {
        Bool tabs = flag != 0 ? yes : no;
        TY_(SetOptionBool)( doc, entry->id, tabs );
        if (tabs) {
            TY_(SetOptionInt)( doc, TidyIndentSpaces, 1 );
        } else {
            /* optional - TY_(ResetOptionToDefault)( doc, TidyIndentSpaces ); */
        }
    }
    return status;
}